

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v10::detail::bigint::assign(bigint *this,bigint *other)

{
  size_t count;
  uint *begin;
  uint *out;
  uint *data;
  size_t size;
  bigint *other_local;
  bigint *this_local;
  
  count = buffer<unsigned_int>::size((buffer<unsigned_int> *)other);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::resize
            (&this->bigits_,count);
  begin = buffer<unsigned_int>::data((buffer<unsigned_int> *)other);
  out = buffer<unsigned_int>::data((buffer<unsigned_int> *)this);
  copy_str<unsigned_int,unsigned_int_const*,unsigned_int*>(begin,begin + count,out);
  this->exp_ = other->exp_;
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign(const bigint& other) {
    auto size = other.bigits_.size();
    bigits_.resize(size);
    auto data = other.bigits_.data();
    copy_str<bigit>(data, data + size, bigits_.data());
    exp_ = other.exp_;
  }